

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O0

void __thiscall Httpdata::handle_http(Httpdata *this,char *buff)

{
  bool bVar1;
  int iVar2;
  Http_Handle *pHVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  ostream *this_00;
  unsigned_long uVar8;
  undefined8 uVar9;
  bool local_50a;
  bool local_4e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8 [8];
  string send_str;
  __cxx11 local_498 [32];
  string local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  __cxx11 local_418 [32];
  string local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  char *local_310;
  char *ptr;
  string local_300 [4];
  int request_fd;
  string request_file_name;
  __cxx11 local_2e0 [32];
  string local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  __cxx11 local_260 [32];
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  dirent *local_110;
  dirent *p_entry;
  DIR *source;
  string local_f8 [8];
  string body;
  allocator local_d1;
  string local_d0 [8];
  string head;
  allocator local_a9;
  string local_a8 [37];
  byte local_83;
  byte local_82;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [48];
  Http_Handle *local_28;
  Http_Handle *Recv_Http;
  char *pcStack_18;
  int index;
  char *buff_local;
  Httpdata *this_local;
  
  Recv_Http._4_4_ = 0;
  pcStack_18 = buff;
  buff_local = (char *)this;
  pHVar3 = (Http_Handle *)operator_new(0xb8);
  Http_Handle::Http_Handle(pHVar3);
  local_28 = pHVar3;
  handle_request_line(this,pcStack_18,(int *)((long)&Recv_Http + 4),pHVar3);
  handle_request_head(this,pcStack_18,(int *)((long)&Recv_Http + 4),local_28);
  puVar4 = &local_28->request_head;
  std::allocator<char>::allocator();
  local_82 = 0;
  local_83 = 0;
  bVar1 = false;
  std::__cxx11::string::string(local_58,"Connection",&local_59);
  sVar5 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(puVar4,(key_type *)local_58);
  local_4e9 = false;
  if (sVar5 != 0) {
    puVar4 = &local_28->request_head;
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string(local_80,"Connection",&local_81);
    local_83 = 1;
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](puVar4,(key_type *)local_80);
    bVar1 = std::operator==(pmVar6,"keep-alive");
    local_50a = true;
    bVar1 = !bVar1;
    if (bVar1) {
      puVar4 = &local_28->request_head;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Connection",&local_a9);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](puVar4,(key_type *)local_a8);
      local_50a = std::operator==(pmVar6,"Keep-Alive");
    }
    local_4e9 = local_50a;
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string(local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (local_4e9 != false) {
    (this->super_channel).field_0x8c = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",(allocator *)((long)&source + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&source + 7));
  bVar1 = std::operator==(&local_28->URI,"/");
  if (bVar1) {
    std::__cxx11::string::operator+=(local_f8,"<html><title>Source Page</title>");
    std::__cxx11::string::operator+=(local_f8,"<body bgcolor=\"ffffff\">");
    std::__cxx11::string::operator+=(local_f8,"!Thank for visiting MRWu_haha\'s Server!");
    std::__cxx11::string::operator+=
              (local_f8,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=utf-8\" />")
    ;
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db00);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db19);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db32);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db4b);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db64);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db7d);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2db96);
    std::__cxx11::string::operator+=(local_f8,anon_var_dwarf_2dba1);
    std::__cxx11::string::operator+=
              (local_f8,"<font size=\"5\"> MR-Wuhaha\'s Source Flie List: </font><br/>");
    p_entry = (dirent *)opendir("/source");
    if (p_entry != (dirent *)0x0) {
      local_110 = (dirent *)0x0;
      while (local_110 = readdir((DIR *)p_entry), local_110 != (dirent *)0x0) {
        iVar2 = strcmp(".",local_110->d_name);
        if ((iVar2 != 0) && (iVar2 = strcmp("..",local_110->d_name), iVar2 != 0)) {
          pcVar7 = local_110->d_name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b0,pcVar7,&local_1b1);
          std::operator+((char *)local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "<br><a href=\"/source/");
          std::operator+(local_170,(char *)local_190);
          pcVar7 = local_110->d_name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d8,pcVar7,&local_1d9);
          std::operator+(local_150,local_170);
          std::operator+(local_130,(char *)local_150);
          std::__cxx11::string::operator+=(local_f8,(string *)local_130);
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string((string *)local_150);
          std::__cxx11::string::~string(local_1d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
          std::__cxx11::string::~string((string *)local_170);
          std::__cxx11::string::~string(local_190);
          std::__cxx11::string::~string(local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        }
      }
      closedir((DIR *)p_entry);
    }
    std::__cxx11::string::operator+=(local_f8,"</body></html>");
    std::operator+(local_200,(char *)&local_28->_version);
    std::__cxx11::string::operator+=(local_d0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::operator+=(local_d0,"Connection: Keep-Alive\r\n");
    std::__cxx11::string::operator+=(local_d0,"Content-type: text/html\r\n");
    uVar8 = std::__cxx11::string::size();
    std::__cxx11::to_string(local_260,uVar8);
    std::operator+((char *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Content-Length: ");
    std::operator+(local_220,(char *)local_240);
    std::__cxx11::string::operator+=(local_d0,(string *)local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::operator+=(local_d0,"\r\n");
  }
  else {
    bVar1 = std::operator==(&local_28->URI,"/hello");
    if (bVar1) {
      std::__cxx11::string::operator+=(local_f8,"<html><title>Hello</title>");
      std::__cxx11::string::operator+=(local_f8,"<body bgcolor=\"ffffff\">");
      std::__cxx11::string::operator+=(local_f8,"Thank for visiting this server!!!!");
      std::__cxx11::string::operator+=
                (local_f8,"<hr><em> MR_Wuhaha\'s WebServer </em>\n</body></html>");
      std::operator+(local_280,(char *)&local_28->_version);
      std::__cxx11::string::operator+=(local_d0,(string *)local_280);
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::string::operator+=(local_d0,"Connection: Keep-Alive\r\n");
      std::__cxx11::string::operator+=(local_d0,"Content-Type: text/html\r\n");
      uVar8 = std::__cxx11::string::size();
      std::__cxx11::to_string(local_2e0,uVar8);
      std::operator+((char *)local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Content-Length: ");
      std::operator+(local_2a0,(char *)local_2c0);
      std::__cxx11::string::operator+=(local_d0,(string *)local_2a0);
      std::__cxx11::string::~string((string *)local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string((string *)local_2e0);
      std::__cxx11::string::operator+=(local_d0,"\r\n");
    }
    else {
      std::__cxx11::string::string(local_300,(string *)&local_28->URI);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      ptr._4_4_ = open(pcVar7,0);
      if (ptr._4_4_ < 0) {
        this_00 = std::operator<<((ostream *)&std::cout,"openfail");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      local_310 = (char *)0x0;
      if ((ptr._4_4_ < 1) ||
         (local_310 = (char *)mmap((void *)0x0,0x1000,1,1,ptr._4_4_,0),
         local_310 == (char *)0xffffffffffffffff)) {
        std::__cxx11::string::operator+=(local_f8,"<html><title>Source Not Found</title>");
        std::__cxx11::string::operator+=(local_f8,"<body bgcolor=\"ffffff\">");
        std::__cxx11::string::operator+=(local_f8,"404 NOT_FOUND");
        std::__cxx11::string::operator+=
                  (local_f8,"<hr><em> MR_Wuhaha\'s WebServer </em>\n</body></html>");
        std::operator+(local_438,(char *)&local_28->_version);
        std::__cxx11::string::operator+=(local_d0,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::string::operator+=(local_d0,"Connection: Keep-Alive\r\n");
        std::__cxx11::string::operator+=(local_d0,"Content-Type: text/html\r\n");
        uVar8 = std::__cxx11::string::size();
        std::__cxx11::to_string(local_498,uVar8);
        std::operator+((char *)local_478,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Content-Length: ");
        std::operator+(local_458,(char *)local_478);
        std::__cxx11::string::operator+=(local_d0,(string *)local_458);
        std::__cxx11::string::~string((string *)local_458);
        std::__cxx11::string::~string(local_478);
        std::__cxx11::string::~string((string *)local_498);
        std::__cxx11::string::operator+=(local_d0,"\r\n");
      }
      else {
        std::__cxx11::string::operator+=(local_f8,"<html>");
        std::__cxx11::string::substr((ulong)local_370,(ulong)&local_28->URI);
        std::operator+((char *)local_350,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "<title>");
        std::operator+(local_330,(char *)local_350);
        std::__cxx11::string::operator+=(local_f8,(string *)local_330);
        std::__cxx11::string::~string((string *)local_330);
        std::__cxx11::string::~string(local_350);
        std::__cxx11::string::~string(local_370);
        std::__cxx11::string::operator+=(local_f8,"<head>");
        std::__cxx11::string::operator+=
                  (local_f8,
                   "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\">");
        std::__cxx11::string::operator+=(local_f8,"</head>");
        std::__cxx11::string::operator+=(local_f8,"<body bgcolor=\"ffffff\">");
        std::__cxx11::string::operator+=(local_f8,"MR_Wuhaha\'s WebServer");
        std::__cxx11::string::operator+=
                  (local_f8,
                   "<hr><pre style=\"word-wrap: break-word; white-space: pre-wrap; white-space: -moz-pre-wrap\">"
                  );
        pcVar7 = local_310;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,pcVar7,&local_391);
        std::__cxx11::string::operator+=(local_f8,local_390);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        std::__cxx11::string::operator+=(local_f8,"</pre>\n</body></html>");
        std::operator+(local_3b8,(char *)&local_28->_version);
        std::__cxx11::string::operator+=(local_d0,(string *)local_3b8);
        std::__cxx11::string::~string((string *)local_3b8);
        std::__cxx11::string::operator+=(local_d0,"Connection: Keep-Alive\r\n");
        std::__cxx11::string::operator+=(local_d0,"Content-Type: text/html\r\n");
        uVar8 = std::__cxx11::string::size();
        std::__cxx11::to_string(local_418,uVar8);
        std::operator+((char *)local_3f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Content-Length: ");
        std::operator+(local_3d8,(char *)local_3f8);
        std::__cxx11::string::operator+=(local_d0,(string *)local_3d8);
        std::__cxx11::string::~string((string *)local_3d8);
        std::__cxx11::string::~string(local_3f8);
        std::__cxx11::string::~string((string *)local_418);
        std::__cxx11::string::operator+=(local_d0,"\r\n");
        iVar2 = munmap(local_310,0x1000);
        if (iVar2 != 0) {
          __assert_fail("munmap((void*)ptr,4096) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/Httpdata.cpp"
                        ,0x88,"void Httpdata::handle_http(char *)");
        }
        close(ptr._4_4_);
      }
      std::__cxx11::string::~string(local_300);
    }
  }
  pHVar3 = local_28;
  if (local_28 != (Http_Handle *)0x0) {
    Http_Handle::~Http_Handle(local_28);
    operator_delete(pHVar3);
  }
  std::operator+(local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  pcVar7 = (this->super_channel).write_buff;
  uVar9 = std::__cxx11::string::c_str();
  sprintf(pcVar7,"%s",uVar9);
  iVar2 = std::__cxx11::string::length();
  (this->super_channel).write_length = iVar2;
  (*(this->super_channel)._vptr_channel[5])();
  std::__cxx11::string::~string((string *)local_4b8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

void Httpdata::handle_http(char *buff)
{
    int index = 0;
    Http_Handle *Recv_Http = new Http_Handle();
    handle_request_line(buff,index,Recv_Http);
    handle_request_head(buff,index,Recv_Http);
    if(Recv_Http->request_head.count("Connection") != 0 &&  
        (Recv_Http->request_head["Connection"] == "keep-alive" || 
        Recv_Http->request_head["Connection"] == "Keep-Alive") )
    {
        Keep_Alive = true;
    }
    string head = "";
    string body = "";
    //if(Recv_Http->URI == "222")
    if(Recv_Http->URI == "/")
    {
        body += "<html><title>Source Page</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "!Thank for visiting MRWu_haha's Server!";
        body += "<meta http-equiv=\"Content-Type\" content=\"text/html; charset=utf-8\" />";
        body += "<br><a href=\"http://www.baidu.com\">百度一下</a>";
        body += "<br><a href=\"https://join.qq.com\">腾讯招聘</a>";
        body += "<br><a href=\"https://campus.kuaishou.cn\">快手招聘</a>";
        body += "<br><a href=\"https://uniportal.huawei.com\">华为招聘</a>";
        body += "<br><a href=\"https://campus.163.com\">网易招聘</a>";
        body += "<br><a href=\"https://careers.pinduoduo.com\">拼多多招聘</a>";
        body += "<br><a href=\"https://campus.alibaba.com\">阿里巴巴招聘</a>";
        body += "<br><a href=\"https://campus.bigo.sg\">BIGO招聘</a><br>";
        body += "<font size=\"5\"> MR-Wuhaha's Source Flie List: </font><br/>";
        DIR* source = opendir("/source");
        if(source != nullptr)
        {
            dirent* p_entry = nullptr;
            while((p_entry = readdir(source)) != nullptr)
            {
                if(!(p_entry->d_type & S_IFDIR) && (strcmp(".", p_entry->d_name) != 0 && strcmp("..", p_entry->d_name) != 0))
                {
                    body += "<br><a href=\"/source/" + string(p_entry->d_name) + "\">" + string(p_entry->d_name) + "</a>";
                }
            }
            closedir(source);
        }

        body += "</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else if(Recv_Http->URI == "/hello")
    {
        body += "<html><title>Hello</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "Thank for visiting this server!!!!";
        body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-Type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else
    {
        string request_file_name = Recv_Http->URI;
        int request_fd = open(request_file_name.c_str(),O_RDONLY);
        if(request_fd < 0)
        {
            cout<<"openfail"<<endl;
        }
        char* ptr = nullptr;
        if(request_fd > 0 && (ptr = (char*)mmap(NULL,4096,PROT_READ,MAP_SHARED,request_fd,0)) != MAP_FAILED)
        {
            body += "<html>";
            body += "<title>" + Recv_Http->URI.substr(1) +  "</title>";
            body += "<head>";
            body += "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\">";
            body += "</head>";
            body += "<body bgcolor=\"ffffff\">";
            body += "MR_Wuhaha's WebServer";
            body += "<hr><pre style=\"word-wrap: break-word; white-space: pre-wrap; white-space: -moz-pre-wrap\">";
            body += string(ptr);
            body += "</pre>\n</body></html>";
            head += Recv_Http->_version + " 200 OK\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
            assert(munmap((void*)ptr,4096) == 0);
            close(request_fd);
        }
        else
        {
            body += "<html><title>Source Not Found</title>";
            body += "<body bgcolor=\"ffffff\">";
            body += "404 NOT_FOUND";
            body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
            head += Recv_Http->_version + " 404 NOTFOUND\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
        }
    }
    delete Recv_Http;
    string send_str = head + body;
    sprintf(write_buff, "%s", send_str.c_str());
    write_length = send_str.length();
    HandleWrite();
}